

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalForcesContIntPreInt
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fi)

{
  Map<Eigen::Matrix<double,_48,_1,_0,_48,_1>,_0,_Eigen::Stride<0,_0>_> QiReshapedLiu;
  Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_> PI1;
  Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  undefined1 local_1538 [16];
  Rhs local_1528;
  Matrix3xN *local_1518;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>_>
  *local_1510 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>
  local_1500 [9];
  Matrix3xN local_1380;
  Matrix3xN local_1200;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>_>
  local_1080 [16];
  double local_1070;
  non_const_type local_1068;
  Matrix3xN *local_1058;
  PlainObjectBase<Eigen::Matrix<double,16,16,1,16,16>> local_880 [2128];
  
  local_1538._8_8_ = local_1538._0_8_;
  CalcCoordMatrix(this,&local_1380);
  CalcCoordDerivMatrix(this,&local_1200);
  local_1528._0_8_ = 0x3fe0000000000000;
  local_1510[0] =
       (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>_>
        *)&local_1380;
  Eigen::operator*(local_1500,(double *)&local_1528,(StorageBaseType *)local_1510);
  local_1070 = local_1500[0].m_lhs.m_functor.m_other;
  local_1068 = local_1500[0].m_rhs.m_matrix;
  local_1058 = &local_1380;
  Eigen::PlainObjectBase<Eigen::Matrix<double,16,16,1,16,16>>::
  _set_noalias<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,16,3,0,16,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>const>,Eigen::Matrix<double,3,16,1,3,16>,0>>
            (local_880,local_1080);
  if (this->m_damping_enabled == true) {
    local_1528._0_8_ = &local_1200;
    Eigen::operator*(local_1500,&this->m_Alpha,(StorageBaseType *)&local_1528);
    local_1058 = &local_1380;
    local_1070 = local_1500[0].m_lhs.m_functor.m_other;
    local_1068 = local_1500[0].m_rhs.m_matrix;
    Eigen::MatrixBase<Eigen::Matrix<double,16,16,1,16,16>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,16,16,1,16,16>> *)local_880,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_16,_3,_0,_16,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>,_Eigen::Matrix<double,_3,_16,_1,_3,_16>,_0>_>
                *)local_1080);
  }
  local_1528._0_8_ = local_880;
  local_1510[0] = local_1080;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)local_1500,&this->m_O1,&local_1528);
  local_1538._0_8_ = (StorageBaseType *)local_1510;
  Eigen::
  NoAlias<Eigen::Map<Eigen::Matrix<double,256,1,0,256,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
  operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,256,1,0,256,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
             *)local_1538,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_256,_1,_0,_256,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
             *)local_1500);
  Eigen::MatrixBase<Eigen::Matrix<double,16,16,1,16,16>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_16,_16,_1,_16,_16>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_1500,(MatrixBase<Eigen::Matrix<double,16,16,1,16,16>> *)local_1080,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K3Compact);
  local_1538._0_8_ = &this->m_K13Compact;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)local_1538,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_16,_16,_1,_16,_16>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_1500);
  local_1518 = &local_1380;
  local_1538 = (undefined1  [16])
               Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->m_K13Compact,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_> *)
                          &local_1518);
  Eigen::PlainObjectBase<Eigen::Matrix<double,16,3,1,16,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,16,3,1,16,3>> *)local_1500,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_0>_>
              *)local_1538);
  local_1538._0_8_ = local_1500;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,48,1,0,48,1>,0,Eigen::Stride<0,0>>>
            (Fi,(Map<Eigen::Matrix<double,_48,_1,_0,_48,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1538);
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.  This makes this method well suited for applications with many
    // discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature points
    // used throughout the entire element.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}